

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

port_mapping_t __thiscall
libtorrent::upnp::add_mapping
          (upnp *this,portmap_protocol p,int external_port,endpoint *param_3,string *device)

{
  double __x;
  string *psVar1;
  portmap_protocol pVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  pointer pgVar6;
  difference_type dVar7;
  vector<mapping_t,_port_mapping_t>_conflict *this_00;
  value_type *pvVar8;
  ulong uVar9;
  endpoint *ep;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  mapping_t *m;
  reference local_120;
  rootdevice *d;
  rootdevice *dev;
  iterator __end1;
  iterator __begin1;
  set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
  *__range1;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_ec;
  iterator iStack_e8;
  port_mapping_t mapping_index;
  global_mapping_t local_d8;
  __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
  local_88 [2];
  global_mapping_t *local_78;
  global_mapping_t *local_70;
  __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
  local_68;
  __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
  mapping_it;
  string local_50;
  string *local_30;
  string *device_local;
  endpoint *local_ep_local;
  int external_port_local;
  portmap_protocol p_local;
  upnp *this_local;
  
  local_30 = device;
  device_local = (string *)param_3;
  local_ep_local._0_4_ = external_port;
  local_ep_local._7_1_ = p;
  _external_port_local = this;
  bVar3 = should_log(this);
  if (bVar3) {
    libtorrent::aux::print_endpoint_abi_cxx11_(&local_50,(aux *)param_3,ep);
    ::std::__cxx11::string::c_str();
    __x = (double)::std::__cxx11::string::c_str();
    log(this,__x);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->m_disabled & 1U) == 0) {
    local_70 = (global_mapping_t *)
               ::std::
               vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
               ::begin(&(this->m_mappings).
                        super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                      );
    local_78 = (global_mapping_t *)
               ::std::
               vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
               ::end(&(this->m_mappings).
                      super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                    );
    local_68 = ::std::
               find_if<__gnu_cxx::__normal_iterator<libtorrent::upnp::global_mapping_t*,std::vector<libtorrent::upnp::global_mapping_t,std::allocator<libtorrent::upnp::global_mapping_t>>>,libtorrent::upnp::add_mapping(libtorrent::portmap_protocol,int,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::__cxx11::string_const&)::__0>
                         (local_70,local_78);
    local_88[0]._M_current =
         (global_mapping_t *)
         ::std::
         vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
         ::end(&(this->m_mappings).
                super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
              );
    bVar3 = __gnu_cxx::operator==(&local_68,local_88);
    if (bVar3) {
      sVar5 = ::std::
              vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
              ::size(&(this->m_mappings).
                      super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                    );
      if (0x31 < sVar5) {
        log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                  ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                   ((long)&this_local + 4),-1);
        return (port_mapping_t)this_local._4_4_;
      }
      local_d8.device._M_string_length = 0;
      local_d8.device.field_2._M_allocated_capacity = 0;
      local_d8._32_8_ = 0;
      local_d8.device._M_dataplus = (_Alloc_hider)0x0;
      local_d8.device._1_7_ = 0;
      local_d8.local_ep.impl_.data_.base.sa_data[6] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[7] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[8] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[9] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[10] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[0xb] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[0xc] = '\0';
      local_d8.local_ep.impl_.data_.base.sa_data[0xd] = '\0';
      local_d8.local_ep.impl_.data_._16_8_ = 0;
      local_d8.protocol = none;
      local_d8._1_3_ = 0;
      local_d8.external_port = 0;
      local_d8.local_ep.impl_.data_._0_8_ = 0;
      local_d8.device.field_2._8_8_ = 0;
      global_mapping_t::global_mapping_t(&local_d8);
      ::std::
      vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
      ::push_back(&(this->m_mappings).
                   super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                  ,&local_d8);
      global_mapping_t::~global_mapping_t(&local_d8);
      iStack_e8 = ::std::
                  vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                  ::end(&(this->m_mappings).
                         super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                       );
      local_68 = __gnu_cxx::
                 __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
                 ::operator-(&stack0xffffffffffffff18,1);
    }
    pVar2 = local_ep_local._7_1_;
    pgVar6 = __gnu_cxx::
             __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
             ::operator->(&local_68);
    iVar4 = (int)local_ep_local;
    pgVar6->protocol = pVar2;
    pgVar6 = __gnu_cxx::
             __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
             ::operator->(&local_68);
    pgVar6->external_port = iVar4;
    pgVar6 = __gnu_cxx::
             __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
             ::operator->(&local_68);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=(&pgVar6->local_ep,param_3);
    psVar1 = local_30;
    pgVar6 = __gnu_cxx::
             __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
             ::operator->(&local_68);
    ::std::__cxx11::string::operator=((string *)&pgVar6->device,(string *)psVar1);
    __range1 = (set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                *)::std::
                  vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                  ::begin(&(this->m_mappings).
                           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                         );
    dVar7 = __gnu_cxx::operator-
                      (&local_68,
                       (__normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
                        *)&__range1);
    libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
              (&local_ec,(int)dVar7);
    __end1 = ::std::
             set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
             ::begin(&this->m_devices);
    dev = (rootdevice *)
          ::std::
          set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
          ::end(&this->m_devices);
    while (bVar3 = ::std::operator!=(&__end1,(_Self *)&dev), bVar3) {
      local_120 = ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator*(&__end1);
      d = local_120;
      if ((local_120->disabled & 1U) == 0) {
        m._4_4_ = libtorrent::aux::
                  container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                  ::end_index(&local_120->mapping);
        bVar3 = libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator<=
                          ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)((long)&m + 4)
                           ,&local_ec);
        if (bVar3) {
          this_00 = &local_120->mapping;
          iVar4 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_ec)
          ;
          libtorrent::aux::
          container_wrapper<libtorrent::upnp::mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::upnp::mapping_t,std::allocator<libtorrent::upnp::mapping_t>>>
          ::resize<int,void>((container_wrapper<libtorrent::upnp::mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::upnp::mapping_t,std::allocator<libtorrent::upnp::mapping_t>>>
                              *)this_00,iVar4 + 1);
        }
        pvVar8 = libtorrent::aux::
                 container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                 ::operator[](&local_120->mapping,local_ec);
        (pvVar8->super_base_mapping).act = add;
        (pvVar8->super_base_mapping).protocol = local_ep_local._7_1_;
        (pvVar8->super_base_mapping).external_port = (int)local_ep_local;
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                  ((basic_endpoint<boost::asio::ip::tcp> *)&(pvVar8->super_base_mapping).field_0x14,
                   param_3);
        ::std::__cxx11::string::operator=((string *)&pvVar8->device,(string *)local_30);
        uVar9 = ::std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          update_map(this,local_120,(port_mapping_t)local_ec.m_val);
        }
      }
      ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator++(&__end1);
    }
    this_local._4_4_ = local_ec.m_val;
  }
  else {
    libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
              ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)((long)&this_local + 4),-1
              );
  }
  return (port_mapping_t)this_local._4_4_;
}

Assistant:

port_mapping_t upnp::add_mapping(portmap_protocol const p, int const external_port
	, tcp::endpoint const local_ep, std::string const& device)
{
	TORRENT_ASSERT(is_single_thread());
	// external port 0 means _every_ port
	TORRENT_ASSERT(external_port != 0);

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("adding port map: [ protocol: %s ext_port: %d "
			"local_ep: %s device: %s] %s", (p == portmap_protocol::tcp?"tcp":"udp")
			, external_port
			, print_endpoint(local_ep).c_str(), device.c_str()
			, m_disabled ? "DISABLED": "");
	}
#endif
	if (m_disabled) return port_mapping_t{-1};

	auto mapping_it = std::find_if(m_mappings.begin(), m_mappings.end()
		, [](global_mapping_t const& m) { return m.protocol == portmap_protocol::none; });

	if (mapping_it == m_mappings.end())
	{
		TORRENT_ASSERT(m_mappings.size() <= max_global_mappings);
		if (m_mappings.size() >= max_global_mappings)
		{
#ifndef TORRENT_DISABLE_LOGGING
			log("too many mappings registered");
#endif
			return port_mapping_t{-1};
		}
		m_mappings.push_back(global_mapping_t());
		mapping_it = m_mappings.end() - 1;
	}

	mapping_it->protocol = p;
	mapping_it->external_port = external_port;
	mapping_it->local_ep = local_ep;
	mapping_it->device = device;

	port_mapping_t const mapping_index{static_cast<int>(mapping_it - m_mappings.begin())};

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;

		if (d.mapping.end_index() <= mapping_index)
			d.mapping.resize(static_cast<int>(mapping_index) + 1);
		mapping_t& m = d.mapping[mapping_index];

		m.act = portmap_action::add;
		m.protocol = p;
		m.external_port = external_port;
		m.local_ep = local_ep;
		m.device = device;

		if (!d.service_namespace.empty()) update_map(d, mapping_index);
	}

	return port_mapping_t{mapping_index};
}